

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder * capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                    (Builder *__return_storage_ptr__,PointerBuilder builder,StructSchema schema)

{
  StructBuilder builder_00;
  bool bVar1;
  StructSize size;
  StructBuilder local_c0;
  Schema local_98;
  Fault local_80;
  Fault f;
  Reader local_48;
  bool local_12;
  DebugExpression<bool> local_11;
  Schema SStack_10;
  DebugExpression<bool> _kjCondition;
  StructSchema schema_local;
  
  SStack_10 = schema.super_Schema.raw;
  Schema::getProto((Reader *)&f,&stack0xfffffffffffffff0);
  capnp::schema::Node::Reader::getStruct(&local_48,(Reader *)&f);
  bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup(&local_48);
  local_12 = (bool)((bVar1 ^ 0xffU) & 1);
  local_11 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_12);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_11);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x776,FAILED,"!schema.getProto().getStruct().getIsGroup()",
               "_kjCondition,\"Cannot form pointer to group type.\"",&local_11,
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal(&local_80);
  }
  local_98.raw = SStack_10.raw;
  size = anon_unknown_70::structSizeFromSchema((StructSchema)SStack_10.raw);
  PointerBuilder::getStruct(&local_c0,&builder,size,(word *)0x0);
  builder_00.capTable = local_c0.capTable;
  builder_00.segment = local_c0.segment;
  builder_00.data = local_c0.data;
  builder_00.pointers = local_c0.pointers;
  builder_00.dataSize = local_c0.dataSize;
  builder_00.pointerCount = local_c0.pointerCount;
  builder_00._38_2_ = local_c0._38_2_;
  DynamicStruct::Builder::Builder(__return_storage_ptr__,(StructSchema)local_98.raw,builder_00);
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Builder PointerHelpers<DynamicStruct, Kind::OTHER>::getDynamic(
    PointerBuilder builder, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Builder(schema, builder.getStruct(
      structSizeFromSchema(schema), nullptr));
}